

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O1

int startofsecdef(lword *s_addr,char *s_type,lword *s_lma)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  char *pcVar6;
  undefined8 uVar7;
  int iVar8;
  lword current_addr;
  
  if (current_ls == (LinkedSection *)0x0) {
    current_addr = -2;
  }
  else {
    current_addr = current_ls->relocmem->current;
  }
  *s_type = '\0';
  cVar2 = getchr();
  iVar8 = 1;
  if (cVar2 == '(') {
LAB_0011348d:
    if ((cVar2 == '(') && (pcVar6 = getarg('\x01'), pcVar6 != (char *)0x0)) {
      strcpy(s_type,pcVar6);
      cVar2 = getchr();
      pcVar6 = scriptname;
      if (cVar2 != ')') {
        uVar3 = getlineno();
        iVar8 = 0;
        error(0x42,pcVar6,(ulong)uVar3,0x29);
        back(1);
      }
      cVar2 = getchr();
    }
  }
  else if (cVar2 != ':') {
    back(1);
    parse_expr(current_addr,s_addr);
    iVar8 = 3;
    cVar2 = getchr();
    goto LAB_0011348d;
  }
  pcVar6 = scriptname;
  if (cVar2 != ':') {
    uVar3 = getlineno();
    error(0x42,pcVar6,(ulong)uVar3,0x3a);
    back(1);
    return 0;
  }
  pcVar6 = getarg('\x01');
  if (pcVar6 != (char *)0x0) {
    iVar4 = strcmp(pcVar6,"AT");
    pcVar1 = scriptname;
    if (iVar4 == 0) {
      cVar2 = getchr();
      pcVar6 = scriptname;
      if (cVar2 == '(') {
        parse_expr(current_addr,s_lma);
        iVar4 = iVar8 + 4;
        if (iVar8 == 0) {
          iVar4 = iVar8;
        }
        iVar8 = iVar4;
        cVar2 = getchr();
        pcVar6 = scriptname;
        if (cVar2 == ')') goto LAB_001135e6;
        uVar3 = getlineno();
        uVar7 = 0x29;
      }
      else {
        uVar3 = getlineno();
        uVar7 = 0x28;
      }
      iVar8 = 0;
      error(0x42,pcVar6,(ulong)uVar3,uVar7);
      back(1);
    }
    else {
      uVar3 = getlineno();
      error(0x41,pcVar1,(ulong)uVar3,pcVar6);
    }
  }
LAB_001135e6:
  bVar5 = startofblock('{');
  if (bVar5 == 0) {
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int startofsecdef(lword *s_addr,char *s_type,lword *s_lma)
/* Parse syntax of section definition until '{' and return VMA address,
   LMA address and type, when given.
   Returns bitfield. 0 when syntax is incorrect, 1 for correct,
   3 for s_addr set, 5 for s_lma set and 7 for both.
   Syntax: [addr-expr] [(type)] : [AT(lma)] { */
{
  int ret = 1;
  lword caddr = -2; /* this prevents expression evaluation during pre-parse */
  char *buf,c;

  if (current_ls)
    caddr = current_ls->relocmem->current;

  *s_type = 0;

  c = getchr();
  if (c != ':') {
    if (c != '(') {
      back(1);
      parse_expr(caddr,s_addr);
#if 0 /* @@@ not needed? address must be within memory region */
      if (current_ls) {
        if (current_ls->relocmem != defmem) {
          /* warning: address overrides specified VMA memory region */
          error(76,scriptname,getlineno(),'V');
          current_ls->relocmem = defmem;
        }
      }
#endif
      ret |= 2;
      c = getchr();
    }
    if (c == '(') {
      if (buf = getword()) {
        strcpy(s_type,buf);
        if (getchr() != ')') {
          error(66,scriptname,getlineno(),')');  /* ')' expected */
          back(1);
          ret = 0;
        }
        c = getchr();
      }
    }
  }

  if (c != ':') {
    error(66,scriptname,getlineno(),':');  /* ':' expected */
    back(1);
    return 0;
  }

  if (buf = getword()) {
    if (!strcmp(buf,"AT")) {
      if (getchr()=='(') {
        parse_expr(caddr,s_lma);
#if 0 /* @@@ not needed? address must be within memory region */
        if (current_ls) {
          if (current_ls->destmem != defmem) {
            if (current_ls->destmem != current_ls->relocmem) {
              /* warning: address overrides specified LMA memory region */
              error(76,scriptname,getlineno(),'L');
            }
            current_ls->destmem = atdefmem;
          }
        }
#endif
        if (ret)
          ret |= 4;
        if (getchr() != ')') {
          error(66,scriptname,getlineno(),')');  /* ')' expected */
          back(1);
          ret = 0;
        }
      }
      else {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        ret = 0;
      }
    }
    else
      error(65,scriptname,getlineno(),buf);  /* unknown keyword ignored */
  }

  if (!startofblock('{'))
    ret = 0;

  return ret;
}